

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadtree.h
# Opt level: O0

int __thiscall
quadtree::
Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
::remove(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
         *this,char *__filename)

{
  Node **nodeBox;
  bool bVar1;
  uint uVar2;
  ulong extraout_RAX;
  reference this_00;
  pointer __filename_00;
  undefined7 extraout_var;
  ulong uVar3;
  ulong extraout_RAX_00;
  Node **in_RCX;
  Node **in_RDX;
  Box<float> local_44;
  int local_34;
  Node **ppNStack_30;
  int i;
  Node **value_local;
  Box<float> *box_local;
  Node *node_local;
  Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
  *this_local;
  
  ppNStack_30 = in_RCX;
  value_local = in_RDX;
  box_local = (Box<float> *)__filename;
  node_local = (Node *)this;
  bVar1 = isLeaf(this,(Node *)__filename);
  nodeBox = value_local;
  if (bVar1) {
    removeValue(this,(Node *)box_local,ppNStack_30);
    this_local._7_1_ = true;
    uVar3 = extraout_RAX;
  }
  else {
    local_44 = anon_class_1_0_00000001_for_mGetBox::operator()
                         ((anon_class_1_0_00000001_for_mGetBox *)&this->field_0x18,*ppNStack_30);
    local_34 = getQuadrant(this,(Box<float> *)nodeBox,&local_44);
    if (local_34 == -1) {
      removeValue(this,(Node *)box_local,ppNStack_30);
      uVar3 = extraout_RAX_00;
    }
    else {
      this_00 = std::
                array<std::unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>,_4UL>
                ::operator[]((array<std::unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>,_4UL>
                              *)box_local,(long)local_34);
      __filename_00 =
           std::
           unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
           ::get(this_00);
      computeBox(this,(Box<float> *)value_local,local_34);
      uVar2 = remove(this,(char *)__filename_00);
      uVar3 = (ulong)uVar2;
      if ((uVar2 & 1) != 0) {
        this_local._7_1_ = tryMerge(this,(Node *)box_local);
        uVar3 = CONCAT71(extraout_var,this_local._7_1_);
        goto LAB_00103850;
      }
    }
    this_local._7_1_ = false;
  }
LAB_00103850:
  return (int)CONCAT71((int7)(uVar3 >> 8),this_local._7_1_);
}

Assistant:

bool remove(Node* node, const Box<Float>& box, const T& value)
    {
        assert(node != nullptr);
        assert(box.contains(mGetBox(value)));
        if (isLeaf(node))
        {
            // Remove the value from node
            removeValue(node, value);
            return true;
        }
        else
        {
            // Remove the value in a child if the value is entirely contained in it
            auto i = getQuadrant(box, mGetBox(value));
            if (i != -1)
            {
                if (remove(node->children[static_cast<std::size_t>(i)].get(), computeBox(box, i), value))
                    return tryMerge(node);
            }
            // Otherwise, we remove the value from the current node
            else
                removeValue(node, value);
            return false;
        }
    }